

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceGoniometric::IfcLightSourceGoniometric
          (IfcLightSourceGoniometric *this)

{
  *(undefined ***)&this->field_0xe8 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0xf0 = 0;
  *(char **)&this->field_0xf8 = "IfcLightSourceGoniometric";
  IfcLightSource::IfcLightSource(&this->super_IfcLightSource,&PTR_construction_vtable_24__0089d9f0);
  *(undefined8 *)&(this->super_IfcLightSource).field_0x88 = 0;
  (this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x89d938;
  *(undefined8 *)&this->field_0xe8 = 0x89d9d8;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x89d960;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x89d988;
  *(undefined8 *)&(this->super_IfcLightSource).field_0x80 = 0x89d9b0;
  *(undefined8 *)&(this->super_IfcLightSource).field_0x90 = 0;
  (this->ColourAppearance).ptr.obj = (LazyObject *)0x0;
  (this->ColourAppearance).have = false;
  (this->LightEmissionSource)._M_dataplus._M_p = (pointer)&(this->LightEmissionSource).field_2;
  (this->LightEmissionSource)._M_string_length = 0;
  (this->LightEmissionSource).field_2._M_local_buf[0] = '\0';
  (this->LightDistributionDataSource).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->LightDistributionDataSource).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  return;
}

Assistant:

IfcLightSourceGoniometric() : Object("IfcLightSourceGoniometric") {}